

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O3

LY_ERR lyd_path_list_predicate
                 (lyd_node *node,char **buffer,size_t *buflen,size_t *bufused,ly_bool is_static)

{
  long lVar1;
  int iVar2;
  char *__s;
  byte *pbVar3;
  size_t sVar4;
  size_t sVar5;
  char *pcVar6;
  char *pcVar7;
  uint uVar8;
  char *__s_00;
  ulong size;
  size_t sVar9;
  
  if ((node != (lyd_node *)0x0) &&
     ((node->schema == (lysc_node *)0x0 || ((node->schema->nodetype & 0x711) != 0)))) {
    lVar1._0_4_ = node[1].hash;
    lVar1._4_4_ = node[1].flags;
    for (; lVar1 != 0; lVar1 = *(long *)(lVar1 + 0x18)) {
      pbVar3 = *(byte **)(lVar1 + 8);
      if ((pbVar3 == (byte *)0x0) || ((pbVar3[3] & 1) == 0)) {
        return LY_SUCCESS;
      }
      if ((*pbVar3 & 0xc) == 0) {
        __s = (char *)0x0;
      }
      else {
        __s = *(char **)(lVar1 + 0x38);
        if (__s == (char *)0x0) {
          __s = lyd_value_get_canonical
                          ((ly_ctx *)**(undefined8 **)(pbVar3 + 8),(lyd_value *)(lVar1 + 0x38));
          pbVar3 = *(byte **)(lVar1 + 8);
        }
      }
      __s_00 = *(char **)(pbVar3 + 0x28);
      sVar4 = strlen(__s_00);
      sVar5 = strlen(__s);
      sVar9 = *bufused;
      size = sVar9 + sVar5 + sVar4 + 6;
      if (*buflen < size) {
        if (is_static != '\0') {
          return LY_EINCOMPLETE;
        }
        pcVar6 = (char *)ly_realloc(*buffer,size);
        *buffer = pcVar6;
        if (pcVar6 == (char *)0x0) {
          return LY_EMEM;
        }
        *buflen = size;
        sVar9 = *bufused;
        __s_00 = *(char **)(*(long *)(lVar1 + 8) + 0x28);
      }
      else {
        pcVar6 = *buffer;
      }
      pcVar7 = strchr(__s,0x27);
      uVar8 = (uint)(pcVar7 == (char *)0x0) * 5 + 0x22;
      iVar2 = sprintf(pcVar6 + sVar9,"[%s=%c%s%c]",__s_00,(ulong)uVar8,__s,(ulong)uVar8);
      *bufused = *bufused + (long)iVar2;
    }
  }
  return LY_SUCCESS;
}

Assistant:

LY_ERR
lyd_path_list_predicate(const struct lyd_node *node, char **buffer, size_t *buflen, size_t *bufused, ly_bool is_static)
{
    const struct lyd_node *key;
    size_t len;
    const char *val;
    char quot;

    for (key = lyd_child(node); key && key->schema && (key->schema->flags & LYS_KEY); key = key->next) {
        val = lyd_get_value(key);
        len = 1 + strlen(key->schema->name) + 2 + strlen(val) + 2;
        LY_CHECK_RET(lyd_path_str_enlarge(buffer, buflen, *bufused + len, is_static));

        quot = '\'';
        if (strchr(val, '\'')) {
            quot = '"';
        }
        *bufused += sprintf(*buffer + *bufused, "[%s=%c%s%c]", key->schema->name, quot, val, quot);
    }

    return LY_SUCCESS;
}